

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nan_handling.hpp
# Opt level: O0

void wdm::utils::remove_incomplete
               (vector<double,_std::allocator<double>_> *x,
               vector<double,_std::allocator<double>_> *y,vector<double,_std::allocator<double>_> *w
               )

{
  uint uVar1;
  int iVar2;
  size_type sVar3;
  vector<double,_std::allocator<double>_> *this;
  reference pvVar4;
  reference pvVar5;
  undefined1 *puVar6;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  bool row_has_nan;
  size_t i;
  size_t last;
  byte local_2b;
  byte local_2a;
  byte local_29;
  undefined1 *__new_size;
  vector<double,_std::allocator<double>_> *__n;
  
  sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RDI);
  this = (vector<double,_std::allocator<double>_> *)(sVar3 - 1);
  __new_size = (undefined1 *)0x0;
  while (__new_size <
         (undefined1 *)
         ((long)&(this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start + 1U)) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(size_type)__new_size);
    uVar1 = std::isnan(*pvVar4);
    local_2a = 1;
    __n = this;
    if ((uVar1 & 1) == 0) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_RSI,(size_type)__new_size);
      iVar2 = std::isnan(*pvVar4);
      local_2a = (byte)iVar2;
      __n = this;
    }
    local_29 = local_2a & 1;
    sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
    if (sVar3 != 0) {
      local_2b = 1;
      if (local_29 == 0) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_RDX,(size_type)__new_size);
        iVar2 = std::isnan(*pvVar4);
        local_2b = (byte)iVar2;
      }
      local_29 = local_2b & 1;
    }
    puVar6 = __new_size;
    this = __n;
    if (local_29 != 0) {
      sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
      if (sVar3 != 0) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_RDX,(size_type)__new_size);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(size_type)__n);
        std::swap<double>(pvVar4,pvVar5);
      }
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_RDI,(size_type)__new_size);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(size_type)__n);
      std::swap<double>(pvVar4,pvVar5);
      puVar6 = __new_size + -1;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_RSI,(size_type)__new_size);
      this = (vector<double,_std::allocator<double>_> *)
             ((long)&__n[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(size_type)__n);
      std::swap<double>(pvVar4,pvVar5);
    }
    __new_size = puVar6 + 1;
  }
  std::vector<double,_std::allocator<double>_>::resize(this,(size_type)__new_size);
  std::vector<double,_std::allocator<double>_>::resize(this,(size_type)__new_size);
  sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
  if (sVar3 != 0) {
    std::vector<double,_std::allocator<double>_>::resize(this,(size_type)__new_size);
  }
  return;
}

Assistant:

inline void remove_incomplete(std::vector<double>& x,
                              std::vector<double>& y,
                              std::vector<double>& w)
{
    // if observation conatins nan, move it to the end
    size_t last = x.size() - 1;
    for (size_t i = 0; i < last + 1; i++) {
        bool row_has_nan = (std::isnan(x[i]) || std::isnan(y[i]));
        if (w.size() > 0)
            row_has_nan = (row_has_nan || std::isnan(w[i]));
        if (row_has_nan) {
            if (w.size() > 0)
                std::swap(w[i], w[last]);
            std::swap(x[i], x[last]);
            std::swap(y[i--], y[last--]);
        }
    }

    x.resize(last + 1);
    y.resize(last + 1);
    if (w.size() > 0)
        w.resize(last + 1);
}